

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkStrash.c
# Opt level: O3

Aig_Man_t * Nwk_ManStrash(Nwk_Man_t *pNtk)

{
  char *pcVar1;
  void **ppvVar2;
  void *pvVar3;
  Nwk_Obj_t *pObj;
  int nNodesMax;
  uint uVar4;
  Aig_Man_t *p;
  size_t sVar5;
  char *pcVar6;
  Tim_Man_t *p_00;
  long lVar7;
  Vec_Ptr_t *__ptr;
  Aig_Obj_t *pAVar8;
  long lVar9;
  float fVar10;
  
  nNodesMax = Nwk_ManGetAigNodeNum(pNtk);
  p = Aig_ManStart(nNodesMax);
  pcVar1 = pNtk->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p->pName = pcVar6;
  pcVar1 = pNtk->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p->pSpec = pcVar6;
  p_00 = Tim_ManDup(pNtk->pManTime,1);
  p->pManTime = p_00;
  Tim_ManIncrementTravId(p_00);
  lVar7 = (long)pNtk->vObjs->nSize;
  if (0 < lVar7) {
    ppvVar2 = pNtk->vObjs->pArray;
    lVar9 = 0;
    do {
      pvVar3 = ppvVar2[lVar9];
      if (pvVar3 != (void *)0x0) {
        *(undefined8 *)((long)pvVar3 + 0x10) = 0;
      }
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
  }
  __ptr = Nwk_ManDfs(pNtk);
  if (0 < __ptr->nSize) {
    lVar7 = 0;
    do {
      pObj = (Nwk_Obj_t *)__ptr->pArray[lVar7];
      uVar4 = *(uint *)&pObj->field_0x20 & 7;
      if (uVar4 == 3) {
        pAVar8 = Nwk_ManStrashNode(p,pObj);
      }
      else if (uVar4 == 2) {
        pAVar8 = Aig_ObjCreateCo(p,(Aig_Obj_t *)
                                   ((ulong)(*(uint *)&pObj->field_0x20 >> 3 & 1) ^
                                   (ulong)(*pObj->pFanio)->pCopy));
        if (((ulong)pAVar8 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x143,"int Aig_ObjLevel(Aig_Obj_t *)");
        }
        Tim_ManSetCoArrival((Tim_Man_t *)p->pManTime,*(uint *)&pObj->field_0x20 >> 7,
                            (float)(*(uint *)&pAVar8->field_0x1c & 0xffffff));
      }
      else {
        if (uVar4 != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkStrash.c"
                        ,0x86,"Aig_Man_t *Nwk_ManStrash(Nwk_Man_t *)");
        }
        pAVar8 = Aig_ObjCreateCi(p);
        fVar10 = Tim_ManGetCiArrival((Tim_Man_t *)p->pManTime,*(uint *)&pObj->field_0x20 >> 7);
        if (((ulong)pAVar8 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x145,"int Aig_ObjSetLevel(Aig_Obj_t *, int)");
        }
        *(ulong *)&pAVar8->field_0x18 =
             *(ulong *)&pAVar8->field_0x18 & 0xff000000ffffffff |
             (ulong)((int)fVar10 & 0xffffff) << 0x20;
      }
      pObj->pCopy = pAVar8;
      lVar7 = lVar7 + 1;
    } while (lVar7 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  Aig_ManCleanup(p);
  Aig_ManSetRegNum(p,0);
  return p;
}

Assistant:

Aig_Man_t * Nwk_ManStrash( Nwk_Man_t * pNtk )
{
    Vec_Ptr_t * vObjs;
    Aig_Man_t * pMan;
    Aig_Obj_t * pObjNew = NULL;
    Nwk_Obj_t * pObj;
    int i, Level;
    pMan = Aig_ManStart( Nwk_ManGetAigNodeNum(pNtk) );
    pMan->pName = Abc_UtilStrsav( pNtk->pName );
    pMan->pSpec = Abc_UtilStrsav( pNtk->pSpec );
    pMan->pManTime = Tim_ManDup( (Tim_Man_t *)pNtk->pManTime, 1 );
    Tim_ManIncrementTravId( (Tim_Man_t *)pMan->pManTime );
    Nwk_ManForEachObj( pNtk, pObj, i )
        pObj->pCopy = NULL;
//    Nwk_ManForEachObj( pNtk, pObj, i )
    vObjs = Nwk_ManDfs( pNtk );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vObjs, pObj, i )
    {
        if ( Nwk_ObjIsCi(pObj) )
        {
            pObjNew = Aig_ObjCreateCi(pMan);
            Level = Tim_ManGetCiArrival( (Tim_Man_t *)pMan->pManTime, pObj->PioId );
            Aig_ObjSetLevel( pObjNew, Level );
        }
        else if ( Nwk_ObjIsCo(pObj) )
        {
            pObjNew = Aig_ObjCreateCo( pMan, Aig_NotCond((Aig_Obj_t *)Nwk_ObjFanin0(pObj)->pCopy, pObj->fInvert) );
            Level = Aig_ObjLevel( pObjNew );
            Tim_ManSetCoArrival( (Tim_Man_t *)pMan->pManTime, pObj->PioId, (float)Level );
        }
        else if ( Nwk_ObjIsNode(pObj) )
        {
            pObjNew = Nwk_ManStrashNode( pMan, pObj );
        }
        else
            assert( 0 );
        pObj->pCopy = pObjNew;
    }
    Vec_PtrFree( vObjs );
    Aig_ManCleanup( pMan );
    Aig_ManSetRegNum( pMan, 0 );
    return pMan;
}